

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_fill_rect_multi_color
               (nk_draw_list *list,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  uint uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  void *pvVar17;
  nk_draw_index *pnVar18;
  nk_draw_index nVar19;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_colorf color;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_vec2 local_b8;
  float local_98;
  float fStack_94;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x224c,
                  "void nk_draw_list_fill_rect_multi_color(struct nk_draw_list *, struct nk_rect, struct nk_color, struct nk_color, struct nk_color, struct nk_color)"
                 );
  }
  nk_draw_list_push_image(list,(list->config).null.texture);
  uVar1 = list->vertex_count;
  pvVar17 = nk_draw_list_alloc_vertices(list,4);
  pnVar18 = nk_draw_list_alloc_elements(list,6);
  if (pnVar18 != (nk_draw_index *)0x0 && pvVar17 != (void *)0x0) {
    color.r = (float)((uint)left & 0xff) * 0.003921569;
    color.g = (float)((uint)left >> 8 & 0xff) * 0.003921569;
    color.b = (float)((uint)left >> 0x10 & 0xff) * 0.003921569;
    color.a = (float)((uint)left >> 0x18) * 0.003921569;
    uVar11 = (ulong)right._0_2_ & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar11;
    auVar2[0xc] = right.a;
    auVar3[8] = right.b;
    auVar3._0_8_ = uVar11;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar14._5_8_ = 0;
    auVar14._0_5_ = auVar3._8_5_;
    auVar4[4] = right.g;
    auVar4._0_4_ = (int)uVar11;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar14 << 0x40,6);
    color_01.a = (float)((uint)right >> 0x18) * 0.003921569;
    color_01.b = (float)((uint)right >> 0x10 & 0xff) * 0.003921569;
    uVar12 = (ulong)top._0_2_ & 0xffffffffffff00ff;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar12;
    auVar5[0xc] = top.a;
    auVar6[8] = top.b;
    auVar6._0_8_ = uVar12;
    auVar6[9] = 0;
    auVar6._10_3_ = auVar5._10_3_;
    auVar15._5_8_ = 0;
    auVar15._0_5_ = auVar6._8_5_;
    auVar7[4] = top.g;
    auVar7._0_4_ = (int)uVar12;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar15 << 0x40,6);
    color_00.a = (float)((uint)top >> 0x18) * 0.003921569;
    color_00.b = (float)((uint)top >> 0x10 & 0xff) * 0.003921569;
    uVar13 = (ulong)bottom._0_2_ & 0xffffffffffff00ff;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar13;
    auVar8[0xc] = bottom.a;
    auVar9[8] = bottom.b;
    auVar9._0_8_ = uVar13;
    auVar9[9] = 0;
    auVar9._10_3_ = auVar8._10_3_;
    auVar16._5_8_ = 0;
    auVar16._0_5_ = auVar9._8_5_;
    auVar10[4] = bottom.g;
    auVar10._0_4_ = (int)uVar13;
    auVar10[5] = 0;
    auVar10._6_7_ = SUB137(auVar16 << 0x40,6);
    color_02.a = (float)((uint)bottom >> 0x18) * 0.003921569;
    color_02.b = (float)((uint)bottom >> 0x10 & 0xff) * 0.003921569;
    nVar19 = (nk_draw_index)uVar1;
    *pnVar18 = nVar19;
    pnVar18[1] = nVar19 + 1;
    pnVar18[2] = nVar19 + 2;
    pnVar18[3] = nVar19;
    pnVar18[4] = nVar19 + 2;
    pnVar18[5] = nVar19 + 3;
    pvVar17 = nk_draw_vertex(pvVar17,(nk_convert_config *)(list->config).vertex_layout,rect._0_8_,
                             (list->config).null.uv,color);
    local_b8.x = rect.w;
    local_b8.y = rect.h;
    local_98 = rect.x;
    fStack_94 = rect.y;
    local_b8.x = local_b8.x + local_98;
    local_b8.y = local_b8.y + fStack_94;
    pos.y = fStack_94;
    pos.x = local_b8.x;
    color_00.g = (float)auVar7._4_4_ * 0.003921569;
    color_00.r = (float)(int)uVar12 * 0.003921569;
    pvVar17 = nk_draw_vertex(pvVar17,(nk_convert_config *)(list->config).vertex_layout,pos,
                             (list->config).null.uv,color_00);
    color_01.g = (float)auVar4._4_4_ * 0.003921569;
    color_01.r = (float)(int)uVar11 * 0.003921569;
    pvVar17 = nk_draw_vertex(pvVar17,(nk_convert_config *)(list->config).vertex_layout,local_b8,
                             (list->config).null.uv,color_01);
    pos_00.y = local_b8.y;
    pos_00.x = local_98;
    color_02.g = (float)auVar10._4_4_ * 0.003921569;
    color_02.r = (float)(int)uVar13 * 0.003921569;
    nk_draw_vertex(pvVar17,(nk_convert_config *)(list->config).vertex_layout,pos_00,
                   (list->config).null.uv,color_02);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_rect_multi_color(struct nk_draw_list *list, struct nk_rect rect,
    struct nk_color left, struct nk_color top, struct nk_color right,
    struct nk_color bottom)
{
    void *vtx;
    struct nk_colorf col_left, col_top;
    struct nk_colorf col_right, col_bottom;
    nk_draw_index *idx;
    nk_draw_index index;

    nk_color_fv(&col_left.r, left);
    nk_color_fv(&col_right.r, right);
    nk_color_fv(&col_top.r, top);
    nk_color_fv(&col_bottom.r, bottom);

    NK_ASSERT(list);
    if (!list) return;

    nk_draw_list_push_image(list, list->config.null.texture);
    index = (nk_draw_index)list->vertex_count;
    vtx = nk_draw_list_alloc_vertices(list, 4);
    idx = nk_draw_list_alloc_elements(list, 6);
    if (!vtx || !idx) return;

    idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
    idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
    idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y), list->config.null.uv, col_left);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y), list->config.null.uv, col_top);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y + rect.h), list->config.null.uv, col_right);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y + rect.h), list->config.null.uv, col_bottom);
}